

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O1

S64 __thiscall I2sSimulationDataGenerator::GetNextAudioWord(I2sSimulationDataGenerator *this)

{
  pointer plVar1;
  S64 SVar2;
  uint uVar3;
  
  plVar1 = (this->mSineWaveSamplesLeft).super__Vector_base<long_long,_std::allocator<long_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  SVar2 = plVar1[this->mCurrentAudioWordIndex];
  if (this->mCurrentAudioChannel == Left) {
    this->mCurrentAudioChannel = Right;
    return SVar2;
  }
  this->mCurrentAudioChannel = Left;
  uVar3 = this->mCurrentAudioWordIndex + 1;
  this->mCurrentAudioWordIndex = uVar3;
  if ((ulong)((long)(this->mSineWaveSamplesLeft).
                    super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)plVar1 >> 3) <= (ulong)uVar3) {
    this->mCurrentAudioWordIndex = 0;
  }
  return SVar2;
}

Assistant:

S64 I2sSimulationDataGenerator::GetNextAudioWord()
{
    S64 value;

    // return 0xFFFF;

    if( mCurrentAudioChannel == Left )
    {
        value = mSineWaveSamplesLeft[ mCurrentAudioWordIndex ];
        mCurrentAudioChannel = Right;
    }
    else
    {
        value = mSineWaveSamplesLeft[ mCurrentAudioWordIndex ];
        mCurrentAudioChannel = Left;
        mCurrentAudioWordIndex++;
        if( mCurrentAudioWordIndex >= mSineWaveSamplesLeft.size() )
            mCurrentAudioWordIndex = 0;
    }

    return value;
}